

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O0

int AllocateTransformBuffer(VP8LEncoder *enc,int width,int height)

{
  uint32_t uVar1;
  int iVar2;
  uint64_t nmemb;
  ulong uVar3;
  uint32_t in_EDX;
  uint32_t in_ESI;
  long in_RDI;
  uint32_t *mem;
  uint64_t mem_size;
  uint64_t max_alignment_in_words;
  uint64_t transform_data_size;
  uint64_t argb_scratch_size;
  uint64_t image_size;
  ulong in_stack_ffffffffffffffa0;
  long local_50;
  void *local_48;
  
  if (*(int *)(in_RDI + 0x5c) == 0) {
    local_50 = 0;
  }
  else {
    local_50 = (long)(int)((in_ESI + 1) * 2) + ((long)(int)(in_ESI << 1) + 3U >> 2);
  }
  if ((*(int *)(in_RDI + 0x5c) == 0) && (*(int *)(in_RDI + 0x54) == 0)) {
    nmemb = 0;
  }
  else {
    uVar1 = VP8LSubSampleSize(in_ESI,2);
    in_stack_ffffffffffffffa0 = (ulong)uVar1;
    uVar1 = VP8LSubSampleSize(in_EDX,2);
    nmemb = in_stack_ffffffffffffffa0 * uVar1;
  }
  uVar3 = (long)(int)in_ESI * (long)(int)in_EDX + local_50 + 0x10 + nmemb;
  local_48 = *(void **)(in_RDI + 0x30);
  if ((local_48 == (void *)0x0) || (*(ulong *)(in_RDI + 0x38) < uVar3)) {
    ClearTransformBuffer((VP8LEncoder *)0x184cf1);
    local_48 = WebPSafeMalloc(nmemb,in_stack_ffffffffffffffa0);
    if (local_48 == (void *)0x0) {
      iVar2 = WebPEncodingSetError(*(WebPPicture **)(in_RDI + 8),VP8_ENC_ERROR_OUT_OF_MEMORY);
      return iVar2;
    }
    *(void **)(in_RDI + 0x30) = local_48;
    *(ulong *)(in_RDI + 0x38) = uVar3;
    *(undefined4 *)(in_RDI + 0x18) = 0;
  }
  *(void **)(in_RDI + 0x10) = local_48;
  uVar3 = (long)local_48 + (long)(int)in_ESI * (long)(int)in_EDX * 4 + 0x1f & 0xffffffffffffffe0;
  *(ulong *)(in_RDI + 0x20) = uVar3;
  *(ulong *)(in_RDI + 0x28) = uVar3 + local_50 * 4 + 0x1f & 0xffffffffffffffe0;
  *(uint32_t *)(in_RDI + 0x40) = in_ESI;
  return 1;
}

Assistant:

static int AllocateTransformBuffer(VP8LEncoder* const enc, int width,
                                   int height) {
  const uint64_t image_size = (uint64_t)width * height;
  // VP8LResidualImage needs room for 2 scanlines of uint32 pixels with an extra
  // pixel in each, plus 2 regular scanlines of bytes.
  // TODO(skal): Clean up by using arithmetic in bytes instead of words.
  const uint64_t argb_scratch_size =
      enc->use_predict ? (width + 1) * 2 + (width * 2 + sizeof(uint32_t) - 1) /
                                               sizeof(uint32_t)
                        : 0;
  const uint64_t transform_data_size =
      (enc->use_predict || enc->use_cross_color)
          ? (uint64_t)VP8LSubSampleSize(width, MIN_TRANSFORM_BITS) *
                VP8LSubSampleSize(height, MIN_TRANSFORM_BITS)
          : 0;
  const uint64_t max_alignment_in_words =
      (WEBP_ALIGN_CST + sizeof(uint32_t) - 1) / sizeof(uint32_t);
  const uint64_t mem_size = image_size + max_alignment_in_words +
                            argb_scratch_size + max_alignment_in_words +
                            transform_data_size;
  uint32_t* mem = enc->transform_mem;
  if (mem == NULL || mem_size > enc->transform_mem_size) {
    ClearTransformBuffer(enc);
    mem = (uint32_t*)WebPSafeMalloc(mem_size, sizeof(*mem));
    if (mem == NULL) {
      return WebPEncodingSetError(enc->pic, VP8_ENC_ERROR_OUT_OF_MEMORY);
    }
    enc->transform_mem = mem;
    enc->transform_mem_size = (size_t)mem_size;
    enc->argb_content = kEncoderNone;
  }
  enc->argb = mem;
  mem = (uint32_t*)WEBP_ALIGN(mem + image_size);
  enc->argb_scratch = mem;
  mem = (uint32_t*)WEBP_ALIGN(mem + argb_scratch_size);
  enc->transform_data = mem;

  enc->current_width = width;
  return 1;
}